

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *handler
          )

{
  parse_context_type *this_00;
  internal *piVar1;
  internal *end;
  size_t *psVar2;
  wchar_t wVar3;
  uint uVar4;
  wchar_t *pwVar5;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *in_RAX;
  internal *piVar6;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *pfVar7;
  wchar_t *begin;
  char *message;
  id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
  local_38;
  
  pfVar7 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
           format_str.size_;
  if (format_str.data_ == (wchar_t *)0x0) {
    return;
  }
  end = this + (long)format_str.data_ * 4;
  this_00 = &pfVar7->context_;
  message = "unmatched \'}\' in format string";
  local_38.handler = in_RAX;
  do {
    wVar3 = *(wchar_t *)this;
    piVar6 = this;
    while (wVar3 != L'{') {
      piVar6 = piVar6 + 4;
      if (piVar6 == end) goto LAB_001cf219;
      wVar3 = *(wchar_t *)piVar6;
    }
    for (; this != piVar6; this = this + 8) {
      while (piVar1 = this + 4, *(wchar_t *)this != L'}') {
        this = piVar1;
        if (piVar1 == piVar6) goto LAB_001cf133;
      }
      if ((piVar1 == piVar6) || (*(wchar_t *)piVar1 != L'}')) {
        error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
        break;
      }
    }
LAB_001cf133:
    piVar6 = piVar6 + 4;
    if (piVar6 == end) {
      message = "invalid format string";
      goto LAB_001cf25a;
    }
    if ((char)*(wchar_t *)piVar6 == '}') {
      uVar4 = (pfVar7->context_).next_arg_id_;
      if ((int)uVar4 < 0) {
        error_handler::on_error
                  ((error_handler *)this_00,
                   "cannot switch from manual to automatic argument indexing");
        pfVar7->arg_id_ = 0;
      }
      else {
        (pfVar7->context_).next_arg_id_ = uVar4 + 1;
        pfVar7->arg_id_ = uVar4;
        if (1 < uVar4) {
          error_handler::on_error((error_handler *)this_00,"argument index out of range");
        }
      }
    }
    else if (*(wchar_t *)piVar6 != L'{') {
      local_38.handler = pfVar7;
      piVar6 = (internal *)
               parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                         ((wchar_t *)piVar6,(wchar_t *)end,&local_38);
      if (piVar6 == end) {
LAB_001cf24a:
        message = "missing \'}\' in format string";
        goto LAB_001cf25a;
      }
      if (*(wchar_t *)piVar6 != L'}') {
        if (*(wchar_t *)piVar6 != L':') goto LAB_001cf24a;
        piVar6 = piVar6 + 4;
        pwVar5 = (pfVar7->context_).format_str_.data_;
        (pfVar7->context_).format_str_.data_ = (wchar_t *)piVar6;
        psVar2 = &(pfVar7->context_).format_str_.size_;
        *psVar2 = *psVar2 - ((long)piVar6 - (long)pwVar5 >> 2);
        if ((ulong)pfVar7->arg_id_ < 2) {
          piVar6 = (internal *)(*pfVar7->parse_funcs_[pfVar7->arg_id_])(this_00);
        }
        if ((piVar6 == end) || (*(wchar_t *)piVar6 != L'}')) {
          message = "unknown format specifier";
          goto LAB_001cf25a;
        }
      }
    }
    this = piVar6 + 4;
    if (this == end) {
      return;
    }
  } while( true );
LAB_001cf219:
  while( true ) {
    while (piVar6 = this + 4, *(wchar_t *)this != L'}') {
      this = piVar6;
      if (piVar6 == end) {
        return;
      }
    }
    if ((piVar6 == end) || (*(wchar_t *)piVar6 != L'}')) break;
    this = this + 8;
    if (this == end) {
      return;
    }
  }
LAB_001cf25a:
  error_handler::on_error((error_handler *)this_00,message);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}